

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast_operators.hpp
# Opt level: O1

bool duckdb::TryDecimalStringCast<short,(char)44>
               (char *string_ptr,idx_t string_size,short *result,CastParameters *parameters,
               uint8_t width,uint8_t scale)

{
  byte bVar1;
  short sVar2;
  ulong uVar3;
  bool strict;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  byte bVar9;
  ulong uVar10;
  idx_t iVar11;
  char *pcVar12;
  undefined7 in_register_00000081;
  uint uVar13;
  int iVar14;
  undefined7 in_register_00000089;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  ExponentData exponent;
  string_t value;
  bool local_d5;
  DecimalCastData<short> local_d4;
  CastParameters *local_c8;
  short *local_c0;
  ulong local_b8;
  ulong local_b0;
  string local_a8;
  uint local_88;
  undefined4 local_84;
  undefined8 uStack_80;
  ulong local_78;
  string local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  uVar13 = (uint)CONCAT71(in_register_00000089,scale);
  uVar10 = CONCAT71(in_register_00000081,width) & 0xffffffff;
  bVar17 = false;
  local_d4.result = 0;
  local_d4.width = (uint8_t)uVar10;
  local_d4.excessive_decimals = '\0';
  local_d4.exponent_type = NONE;
  local_d4.digit_count = '\0';
  local_d4.decimal_count = '\0';
  local_d4.round_set = false;
  local_d4.should_round = false;
  local_d4.limit = *(StoreType *)(NumericHelper::POWERS_OF_TEN + uVar10 * 8);
  local_d4.scale = scale;
  if (string_size == 0) goto LAB_00d9e758;
  uVar10 = 0;
  do {
    bVar9 = string_ptr[uVar10];
    if ((4 < bVar9 - 9) && (bVar9 != 0x20)) {
      local_d4.digit_count = 0;
      strict = SUB81(parameters,0);
      local_c8 = parameters;
      local_c0 = result;
      if (bVar9 == 0x2d) {
        local_d4.result = 0;
        uVar3 = string_size - uVar10;
        uVar4 = 1;
        goto LAB_00d9e0a9;
      }
      if (bVar9 == 0x30 && string_size - 1 != uVar10) {
        bVar1 = string_ptr[uVar10 + 1];
        if (bVar1 < 0x62) {
          if ((bVar1 == 0x42) || (bVar1 == 0x58)) {
LAB_00d9e2d2:
            if (0xfffffffffffffffd < (string_size - uVar10) - 3) {
              DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,false>(&local_d4);
              result = local_c0;
            }
            break;
          }
        }
        else if ((bVar1 == 0x62) || (bVar1 == 0x78)) goto LAB_00d9e2d2;
      }
      uVar3 = string_size - uVar10;
      uVar5 = (ulong)(bVar9 == 0x2b);
      local_d4.result = 0;
      uVar4 = uVar5;
      goto LAB_00d9e336;
    }
    uVar10 = uVar10 + 1;
  } while (string_size != uVar10);
LAB_00d9e756:
  bVar17 = false;
  goto LAB_00d9e758;
LAB_00d9e0a9:
  do {
    if (uVar3 <= uVar4) {
      local_d4._5_3_ = 0;
      goto LAB_00d9e1a7;
    }
    bVar9 = string_ptr[uVar10 + uVar4] - 0x30;
    if (9 < bVar9) {
      local_d4._5_3_ = 0;
      if (string_ptr[uVar10 + uVar4] != ',') goto LAB_00d9e5a7;
      uVar5 = uVar4 + 1;
      iVar14 = 3;
      uVar6 = uVar5;
      if (uVar3 <= uVar5) goto LAB_00d9e572;
      local_d4.decimal_count = 0;
      local_b8 = local_b8 & 0xffffffffffffff00;
      local_d5 = false;
      goto LAB_00d9e21a;
    }
    uVar5 = uVar4 + 1;
    if ((bVar9 == 0) && (local_d4.result == 0)) {
LAB_00d9e0d6:
      bVar17 = true;
      if ((~uVar4 + string_size != uVar10) && (string_ptr[uVar10 + 1 + uVar4] == '_')) {
        uVar5 = uVar4 + 2;
        if ((string_size - uVar4) - 2 == uVar10) {
          bVar17 = false;
        }
        else {
          bVar17 = (byte)(string_ptr[uVar10 + uVar5] - 0x30U) < 10;
        }
      }
    }
    else {
      if (((uint)width - (uint)scale != (uint)local_d4.digit_count) &&
         (local_d4.digit_count = local_d4.digit_count + 1, -0xccd < local_d4.result)) {
        local_d4.result = local_d4.result * 10 - (ushort)bVar9;
        goto LAB_00d9e0d6;
      }
      bVar17 = false;
    }
    uVar4 = uVar5;
  } while (bVar17);
  goto LAB_00d9e3e2;
  while (uVar6 = uVar15, uVar15 < uVar3) {
LAB_00d9e21a:
    bVar9 = string_ptr[uVar10 + uVar6] - 0x30;
    local_b0 = uVar5;
    if (9 < bVar9) {
      iVar14 = 0;
      goto LAB_00d9e553;
    }
    if ((local_d4.decimal_count == scale) && ((char)local_b8 == '\0')) {
      local_d5 = 4 < bVar9;
      local_b8 = CONCAT71(local_b8._1_7_,1);
    }
    bVar17 = (uint)local_d4.decimal_count + (uint)local_d4.digit_count < 4;
    sVar2 = local_d4.result * 10 - (ushort)bVar9;
    if (!bVar17) {
      sVar2 = local_d4.result;
    }
    local_d4.result = sVar2;
    local_d4.decimal_count = local_d4.decimal_count + bVar17;
    uVar15 = uVar6 + 1;
    if (((~uVar6 + string_size != uVar10) && (string_ptr[uVar10 + 1 + uVar6] == '_')) &&
       ((uVar15 = uVar6 + 2, (string_size - uVar6) - 2 == uVar10 ||
        (9 < (byte)(string_ptr[uVar10 + uVar15] - 0x30U))))) {
      local_d4.round_set = (bool)(char)local_b8;
      local_d4.should_round = local_d5;
      uVar6 = uVar15;
      iVar7 = 1;
      goto LAB_00d9e589;
    }
  }
  iVar14 = 3;
LAB_00d9e553:
  local_d4.round_set = (bool)(char)local_b8;
  local_d4.should_round = local_d5;
LAB_00d9e572:
  iVar7 = 1;
  if (uVar5 < uVar6) {
    iVar7 = iVar14;
  }
  if (1 < uVar4) {
    iVar7 = iVar14;
  }
LAB_00d9e589:
  uVar4 = uVar6;
  if (iVar7 != 3) {
    if (iVar7 != 0) goto LAB_00d9e756;
LAB_00d9e5a7:
    bVar9 = string_ptr[uVar10 + uVar4];
    bVar17 = false;
    uVar8 = (uint)bVar9;
    if (bVar9 < 0x20) {
      if (4 < uVar8 - 9) goto LAB_00d9e758;
    }
    else {
      if ((bVar9 == 0x65) || (uVar8 == 0x45)) {
        if ((uVar4 != 1) && (uVar4 + 1 < uVar3)) {
          local_a8._M_dataplus._M_p._0_2_ = 0;
          pcVar12 = string_ptr + uVar10 + uVar4 + 1;
          iVar11 = ~uVar10 + (string_size - uVar4);
          if (*pcVar12 == '-') {
            bVar17 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                               (pcVar12,iVar11,(IntegerCastData<short> *)&local_a8,strict);
          }
          else {
            bVar17 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                               (pcVar12,iVar11,(IntegerCastData<short> *)&local_a8,strict);
          }
          if (bVar17 != false) {
            bVar17 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<short>,true>
                               (&local_d4,(int)(short)local_a8._M_dataplus._M_p);
            parameters = local_c8;
            result = local_c0;
            goto LAB_00d9e758;
          }
          goto LAB_00d9e904;
        }
        goto LAB_00d9e756;
      }
      if (uVar8 != 0x20) goto LAB_00d9e758;
    }
    uVar5 = uVar4 + 1;
    uVar4 = uVar5;
    if (uVar5 < uVar3) {
      do {
        if ((4 < (byte)string_ptr[uVar10 + uVar5] - 9) && (string_ptr[uVar10 + uVar5] != 0x20))
        goto LAB_00d9e756;
        uVar5 = uVar5 + 1;
        uVar4 = uVar3;
      } while (uVar3 != uVar5);
    }
  }
LAB_00d9e1a7:
  bVar17 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,true>(&local_d4);
  if (bVar17) {
    bVar17 = 1 < uVar4;
    parameters = local_c8;
    result = local_c0;
    goto LAB_00d9e758;
  }
  goto LAB_00d9e904;
LAB_00d9e336:
  do {
    if (uVar3 <= uVar4) {
      local_d4._5_3_ = 0;
      goto LAB_00d9e401;
    }
    bVar9 = string_ptr[uVar10 + uVar4] - 0x30;
    if (9 < bVar9) {
      local_d4._5_3_ = 0;
      if (string_ptr[uVar10 + uVar4] != ',') goto LAB_00d9e6b4;
      uVar6 = uVar4 + 1;
      iVar14 = 3;
      uVar15 = uVar6;
      if (uVar3 <= uVar6) goto LAB_00d9e680;
      local_d4.decimal_count = 0;
      local_d5 = false;
      local_b0 = local_b0 & 0xffffffffffffff00;
      goto LAB_00d9e47a;
    }
    uVar6 = uVar4 + 1;
    if ((bVar9 == 0) && (local_d4.result == 0)) {
LAB_00d9e363:
      bVar17 = true;
      if ((~uVar4 + string_size != uVar10) && (string_ptr[uVar10 + 1 + uVar4] == '_')) {
        uVar6 = uVar4 + 2;
        if ((string_size - uVar4) - 2 == uVar10) {
          bVar17 = false;
        }
        else {
          bVar17 = (byte)(string_ptr[uVar10 + uVar6] - 0x30U) < 10;
        }
      }
    }
    else {
      if (((uint)width - (uint)scale != (uint)local_d4.digit_count) &&
         (local_d4.digit_count = local_d4.digit_count + 1, local_d4.result < 0xccd)) {
        local_d4.result = (ushort)bVar9 + local_d4.result * 10;
        goto LAB_00d9e363;
      }
      bVar17 = false;
    }
    uVar4 = uVar6;
  } while (bVar17);
LAB_00d9e3e2:
  local_d4._5_3_ = 0;
  goto LAB_00d9e904;
  while (uVar15 = uVar16, uVar16 < uVar3) {
LAB_00d9e47a:
    bVar9 = string_ptr[uVar10 + uVar15] - 0x30;
    local_78 = uVar6;
    if (9 < bVar9) {
      iVar14 = 0;
      goto LAB_00d9e65c;
    }
    if ((local_d4.decimal_count == scale) && (local_d5 == false)) {
      local_b0 = CONCAT71(local_b0._1_7_,4 < bVar9);
      local_d5 = true;
    }
    bVar17 = (uint)local_d4.decimal_count + (uint)local_d4.digit_count < 4;
    sVar2 = (ushort)bVar9 + local_d4.result * 10;
    if (!bVar17) {
      sVar2 = local_d4.result;
    }
    local_d4.result = sVar2;
    local_d4.decimal_count = local_d4.decimal_count + bVar17;
    uVar16 = uVar15 + 1;
    if (((~uVar15 + string_size != uVar10) && (string_ptr[uVar10 + 1 + uVar15] == '_')) &&
       ((uVar16 = uVar15 + 2, (string_size - uVar15) - 2 == uVar10 ||
        (9 < (byte)(string_ptr[uVar10 + uVar16] - 0x30U))))) {
      local_d4.round_set = local_d5;
      local_d4.should_round = (bool)(undefined1)local_b0;
      uVar15 = uVar16;
      iVar7 = 1;
      goto LAB_00d9e696;
    }
  }
  iVar14 = 3;
LAB_00d9e65c:
  local_d4.round_set = local_d5;
  local_d4.should_round = (bool)(undefined1)local_b0;
LAB_00d9e680:
  iVar7 = 1;
  if (uVar6 < uVar15) {
    iVar7 = iVar14;
  }
  if (uVar5 < uVar4) {
    iVar7 = iVar14;
  }
LAB_00d9e696:
  uVar4 = uVar15;
  if (iVar7 != 3) {
    local_b8 = uVar5;
    if (iVar7 != 0) goto LAB_00d9e756;
LAB_00d9e6b4:
    bVar9 = string_ptr[uVar10 + uVar4];
    bVar17 = false;
    uVar8 = (uint)bVar9;
    if (bVar9 < 0x20) {
      local_b8 = uVar5;
      if (4 < uVar8 - 9) goto LAB_00d9e758;
    }
    else {
      if ((bVar9 == 0x65) || (uVar8 == 0x45)) {
        local_b8 = uVar5;
        if ((uVar4 == uVar5) || (uVar3 <= uVar4 + 1)) goto LAB_00d9e756;
        local_a8._M_dataplus._M_p._0_2_ = 0;
        pcVar12 = string_ptr + uVar10 + uVar4 + 1;
        iVar11 = ~uVar10 + (string_size - uVar4);
        if (*pcVar12 == '-') {
          bVar17 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)44>
                             (pcVar12,iVar11,(IntegerCastData<short> *)&local_a8,strict);
        }
        else {
          bVar17 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)44>
                             (pcVar12,iVar11,(IntegerCastData<short> *)&local_a8,strict);
        }
        if (bVar17 != false) {
          bVar17 = DecimalCastOperation::HandleExponent<duckdb::DecimalCastData<short>,false>
                             (&local_d4,(int)(short)local_a8._M_dataplus._M_p);
          parameters = local_c8;
          result = local_c0;
          goto LAB_00d9e758;
        }
        goto LAB_00d9e904;
      }
      local_b8 = uVar5;
      if (uVar8 != 0x20) goto LAB_00d9e758;
    }
    uVar6 = uVar4 + 1;
    uVar4 = uVar6;
    if (uVar6 < uVar3) {
      do {
        if ((4 < (byte)string_ptr[uVar10 + uVar6] - 9) &&
           (local_b8 = uVar5, string_ptr[uVar10 + uVar6] != 0x20)) goto LAB_00d9e756;
        uVar6 = uVar6 + 1;
        uVar4 = uVar3;
      } while (uVar3 != uVar6);
    }
  }
LAB_00d9e401:
  local_b8 = uVar5;
  bVar17 = DecimalCastOperation::Finalize<duckdb::DecimalCastData<short>,false>(&local_d4);
  if (bVar17) {
    bVar17 = local_b8 < uVar4;
    parameters = local_c8;
    result = local_c0;
    goto LAB_00d9e758;
  }
LAB_00d9e904:
  bVar17 = false;
  parameters = local_c8;
  result = local_c0;
LAB_00d9e758:
  if (bVar17 == false) {
    local_88 = (uint)string_size;
    uVar8 = uVar13;
    local_c8 = parameters;
    if (local_88 < 0xd) {
      uStack_80._4_4_ = 0;
      local_84 = 0;
      uStack_80._0_4_ = 0;
      uStack_80 = (char *)0x0;
      if (local_88 != 0) {
        switchD_015ff80e::default(&local_84,string_ptr,(ulong)(local_88 & 0xf));
        uStack_80 = (char *)CONCAT44(uStack_80._4_4_,(undefined4)uStack_80);
      }
    }
    else {
      local_84 = *(undefined4 *)string_ptr;
      uStack_80 = string_ptr;
    }
    local_50[0] = local_40;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Could not convert string \"%s\" to DECIMAL(%d,%d)","");
    pcVar12 = (char *)&local_84;
    if (0xc < (ulong)local_88) {
      pcVar12 = uStack_80;
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,pcVar12,pcVar12 + local_88);
    StringUtil::Format<std::__cxx11::string,int,int>
              (&local_a8,(StringUtil *)local_50,&local_70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)width,
               uVar13 & 0xff,uVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    HandleCastError::AssignError(&local_a8,local_c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT62(local_a8._M_dataplus._M_p._2_6_,(short)local_a8._M_dataplus._M_p) !=
        &local_a8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT62(local_a8._M_dataplus._M_p._2_6_,(short)local_a8._M_dataplus._M_p));
    }
  }
  else {
    *result = local_d4.result;
  }
  return bVar17;
}

Assistant:

bool TryDecimalStringCast(const char *string_ptr, idx_t string_size, T &result, CastParameters &parameters,
                          uint8_t width, uint8_t scale) {
	DecimalCastData<T> state;
	state.result = 0;
	state.width = width;
	state.scale = scale;
	state.digit_count = 0;
	state.decimal_count = 0;
	state.excessive_decimals = 0;
	state.exponent_type = ExponentType::NONE;
	state.round_set = false;
	state.should_round = false;
	state.limit = UnsafeNumericCast<T>(DecimalCastTraits<T>::POWERS_OF_TEN_CLASS::POWERS_OF_TEN[width]);
	if (!TryIntegerCast<DecimalCastData<T>, true, true, DecimalCastOperation, false, decimal_separator>(
	        string_ptr, string_size, state, false)) {
		string_t value(string_ptr, (uint32_t)string_size);
		string error = StringUtil::Format("Could not convert string \"%s\" to DECIMAL(%d,%d)", value.GetString(),
		                                  (int)width, (int)scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = state.result;
	return true;
}